

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::scrollRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QWidgetPrivate *this_00;
  QWidget *this_01;
  QWidgetRepaintManager *this_02;
  ulong uVar4;
  int in_EDX;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool accelerateScroll;
  bool overlapped;
  QWidgetRepaintManager *repaintManager;
  QWidget *tlw;
  QWidget *q;
  QRegion dirtyScrollRegion;
  QRegion childExpose;
  QRect sourceRect;
  QRect destRect;
  QPoint toplevelOffset;
  QRegion region;
  QRect scrollRect;
  QRect *in_stack_fffffffffffffec8;
  QRect *in_stack_fffffffffffffed0;
  QWidget *in_stack_fffffffffffffed8;
  QWidgetPrivate *in_stack_fffffffffffffee0;
  QWidgetPrivate *in_stack_fffffffffffffee8;
  QWidgetPrivate *in_stack_fffffffffffffef0;
  BufferState in_stack_ffffffffffffff00;
  UpdateTime in_stack_ffffffffffffff04;
  UpdateTime updateTime;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  byte alsoNonOpaque;
  QRegion local_b8;
  QRegion local_b0;
  QRect local_a8;
  QRegion local_98;
  QRegion local_90;
  undefined1 local_88 [16];
  QRect local_78;
  undefined1 local_68 [24];
  QPoint local_50;
  QRegion local_48;
  QPoint local_40;
  QRect local_38;
  QRect local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  this_01 = QWidget::window((QWidget *)in_stack_fffffffffffffee0);
  get((QWidget *)0x3a646b);
  this_02 = maybeRepaintManager(in_stack_fffffffffffffee0);
  if (this_02 != (QWidgetRepaintManager *)0x0) {
    if ((scrollRect(QRect_const&,int,int)::accelEnv == '\0') &&
       (iVar3 = __cxa_guard_acquire(&scrollRect(QRect_const&,int,int)::accelEnv), iVar3 != 0)) {
      iVar3 = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL",(bool *)0x0);
      QWidgetPrivate::scrollRect::accelEnv = iVar3 == 0;
      __cxa_guard_release(&scrollRect(QRect_const&,int,int)::accelEnv);
    }
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = clipRect(in_RDI);
    local_18 = QRect::operator&((QRect *)in_RSI,(QRect *)&local_28);
    alsoNonOpaque = 0;
    updateTime = in_stack_ffffffffffffff04 & 0xffffff;
    if (((QWidgetPrivate::scrollRect::accelEnv & 1U) != 0) &&
       (updateTime = in_stack_ffffffffffffff04 & 0xffffff,
       (*(uint *)&in_RDI->field_0x250 >> 0x11 & 1) != 0)) {
      q_func(in_RDI);
      bVar1 = QWidget::testAttribute
                        (in_stack_fffffffffffffed8,
                         (WidgetAttribute)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      updateTime = updateTime & 0xffffff;
      if (!bVar1) {
        local_40 = QRect::topLeft(in_stack_fffffffffffffec8);
        local_38 = QRect::translated((QRect *)in_RDI,
                                     (QPoint *)CONCAT44(updateTime,in_stack_ffffffffffffff00));
        alsoNonOpaque = isOverlapped(in_stack_fffffffffffffee0,(QRect *)in_stack_fffffffffffffed8);
        updateTime = CONCAT13(alsoNonOpaque,(int3)updateTime) ^ 0xff000000;
      }
    }
    bVar2 = (byte)(updateTime >> 0x18) & 1;
    if ((updateTime & 0x1000000) == UpdateNow) {
      if ((alsoNonOpaque & 1) == 0) {
        invalidateBackingStore<QRect>(in_stack_fffffffffffffef0,(QRect *)in_stack_fffffffffffffee8);
      }
      else {
        local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_48,(QRect *)local_18,Rectangle);
        subtractOpaqueSiblings(this_00,(QRegion *)this_01,(bool *)this_02,(bool)alsoNonOpaque);
        invalidateBackingStore<QRegion>
                  (in_stack_fffffffffffffee8,(QRegion *)in_stack_fffffffffffffee0);
        QRegion::~QRegion(&local_48);
      }
    }
    else {
      local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffed0);
      local_50 = QWidget::mapTo(this_01,(QWidget *)this_00,(QPoint *)in_stack_fffffffffffffee0);
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = QRect::translated((QRect *)in_RDI,updateTime,in_stack_ffffffffffffff00);
      local_68._0_16_ = QRect::operator&(&local_78,(QRect *)local_18);
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = (undefined1  [16])
                 QRect::translated((QRect *)in_RDI,updateTime,in_stack_ffffffffffffff00);
      local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_90,(QRect *)local_18,Rectangle);
      bVar1 = QRect::isValid(in_stack_fffffffffffffed0);
      if (bVar1) {
        bVar1 = QWidgetRepaintManager::bltRect
                          ((QWidgetRepaintManager *)CONCAT44(updateTime,in_stack_ffffffffffffff00),
                           (QRect *)in_RSI,(int)((ulong)this_01 >> 0x20),(int)this_01,
                           (QWidget *)this_00);
        if (bVar1) {
          QRegion::QRegion(&local_98,(QRect *)local_68,Rectangle);
          QRegion::operator-=(&local_90,(QRegion *)&local_98);
          QRegion::~QRegion(&local_98);
        }
      }
      if ((*(uint *)&in_RDI->field_0x250 >> 0x13 & 1) != 0) {
        local_a8 = QWidget::rect((QWidget *)this_00);
        bVar1 = ::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar1) {
          QRegion::translate((int)in_RDI + 0xe0,in_EDX);
        }
        else {
          local_b0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::intersected((QRect *)&local_b0);
          uVar4 = QRegion::isEmpty();
          if ((uVar4 & 1) == 0) {
            QRegion::operator-=(&in_RDI->dirty,(QRegion *)&local_b0);
            QRegion::translate((int)&local_b0,in_EDX);
            QRegion::operator+=(&in_RDI->dirty,(QRegion *)&local_b0);
          }
          QRegion::~QRegion(&local_b0);
        }
      }
      bVar1 = QWidget::updatesEnabled((QWidget *)0x3a6926);
      if (bVar1) {
        uVar4 = QRegion::isEmpty();
        if ((uVar4 & 1) == 0) {
          QWidgetRepaintManager::markDirty<QRegion>
                    (this_02,(QRegion *)
                             CONCAT17(alsoNonOpaque,
                                      CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffff14,
                                                              in_stack_ffffffffffffff10))),
                     (QWidget *)in_RDI,updateTime,in_stack_ffffffffffffff00);
          *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xffefffff | 0x100000;
        }
        QRegion::QRegion(&local_b8,(QRect *)local_68,Rectangle);
        QWidgetRepaintManager::markNeedsFlush
                  ((QWidgetRepaintManager *)CONCAT44(updateTime,in_stack_ffffffffffffff00),in_RSI,
                   (QRegion *)this_01,(QPoint *)this_00);
        QRegion::~QRegion(&local_b8);
      }
      QRegion::~QRegion(&local_90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    QWidget *tlw = q->window();

    QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
    if (!repaintManager)
        return;

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL") == 0;

    const QRect scrollRect = rect & clipRect();
    bool overlapped = false;
    bool accelerateScroll = accelEnv && isOpaque && !q_func()->testAttribute(Qt::WA_WState_InPaintEvent)
                            && !(overlapped = isOverlapped(scrollRect.translated(data.crect.topLeft())));

    if (!accelerateScroll) {
        if (overlapped) {
            QRegion region(scrollRect);
            subtractOpaqueSiblings(region);
            invalidateBackingStore(region);
        }else {
            invalidateBackingStore(scrollRect);
        }
    } else {
        const QPoint toplevelOffset = q->mapTo(tlw, QPoint());
        const QRect destRect = scrollRect.translated(dx, dy) & scrollRect;
        const QRect sourceRect = destRect.translated(-dx, -dy);

        QRegion childExpose(scrollRect);
        if (sourceRect.isValid()) {
            if (repaintManager->bltRect(sourceRect, dx, dy, q))
                childExpose -= destRect;
        }

        if (inDirtyList) {
            if (rect == q->rect()) {
                dirty.translate(dx, dy);
            } else {
                QRegion dirtyScrollRegion = dirty.intersected(scrollRect);
                if (!dirtyScrollRegion.isEmpty()) {
                    dirty -= dirtyScrollRegion;
                    dirtyScrollRegion.translate(dx, dy);
                    dirty += dirtyScrollRegion;
                }
            }
        }

        if (!q->updatesEnabled())
            return;

        if (!childExpose.isEmpty()) {
            repaintManager->markDirty(childExpose, q);
            isScrolled = true;
        }

        // Instead of using native scroll-on-screen, we copy from
        // backingstore, giving only one screen update for each
        // scroll, and a solid appearance
        repaintManager->markNeedsFlush(q, destRect, toplevelOffset);
    }
}